

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_Sessionid_Test::TestBody(InterpreterTestSuite_PC_Sessionid_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  bool bVar3;
  TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *this_00;
  char *in_R9;
  initializer_list<testing::Action<void_(unsigned_short_&)>_> __l;
  Action<void_(unsigned_short_&)> converted;
  Value value;
  TestContext ctx;
  _Any_data local_318;
  code *local_308;
  code *pcStack_300;
  Expression local_2f8;
  _Any_data local_2d8;
  pointer local_2c8;
  undefined8 local_2c0;
  _Any_data local_2b8;
  pointer local_2a8;
  code *local_2a0;
  undefined1 local_298 [8];
  _Alloc_hider _Stack_290;
  undefined1 local_288 [8];
  undefined1 local_280 [16];
  _Alloc_hider local_270;
  _Invoker_type p_Stack_268;
  undefined1 local_260 [16];
  undefined8 local_250;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_248;
  Matcher<unsigned_short_&> local_240;
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  undefined8 local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  MockSpec<ot::commissioner::Error_(unsigned_short_&)> local_1f0;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  Error local_188;
  TestContext local_160;
  
  InterpreterTestSuite::TestContext::TestContext(&local_160);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_160);
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0._0_4_ = kNone;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_240.super_MatcherBase<unsigned_short_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)operator_new(8);
  ((local_240.super_MatcherBase<unsigned_short_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_0039c118;
  local_240.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00397118;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_short&>const*>
            (&local_240.super_MatcherBase<unsigned_short_&>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_240.super_MatcherBase<unsigned_short_&>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_240.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003970d0;
  CommissionerAppMock::gmock_GetSessionId
            (&local_1f0,
             local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_240);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
            InternalExpectedAt(&local_1f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0x6b3,"*ctx.mDefaultCommissionerObject","GetSessionId(_)");
  paVar1 = &local_188.mMessage.field_2;
  local_188.mCode = kNone;
  local_188.mMessage._M_string_length = 0;
  local_188.mMessage.field_2._M_local_buf[0] = '\0';
  local_188.mMessage._M_dataplus._M_p = (pointer)paVar1;
  testing::Return<ot::commissioner::Error>((testing *)&local_250,&local_188);
  local_208 = local_250;
  local_200 = local_248;
  if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_248->_M_use_count = local_248->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_248->_M_use_count = local_248->_M_use_count + 1;
    }
  }
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2a8 = (pointer)std::
                       _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1716:36)>
                       ::_M_manager;
  local_2a0 = std::
              _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1716:36)>
              ::_M_invoke;
  std::function<void_(unsigned_short_&)>::function
            ((function<void_(unsigned_short_&)> *)&local_2d8,
             (function<void_(unsigned_short_&)> *)&local_2b8);
  local_308 = (code *)0x0;
  pcStack_300 = (code *)0x0;
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_8_ = 0;
  local_318._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_318._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_318._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_318._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_318._M_unused._0_8_ + 0x18) = local_2c0;
  if (local_2c8 != (pointer)0x0) {
    *(undefined4 *)local_318._M_unused._0_8_ = local_2d8._0_4_;
    *(undefined4 *)((long)local_318._M_unused._0_8_ + 4) = local_2d8._4_4_;
    *(undefined4 *)((long)local_318._M_unused._0_8_ + 8) = local_2d8._8_4_;
    *(undefined4 *)((long)local_318._M_unused._0_8_ + 0xc) = local_2d8._12_4_;
    *(pointer *)((long)local_318._M_unused._0_8_ + 0x10) = local_2c8;
  }
  local_318._8_8_ = 0;
  local_308 = std::_Function_handler::operator_cast_to_Action;
  pcStack_300 = std::_Function_handler::operator_cast_to_Action;
  if (local_2a8 != (pointer)0x0) {
    (*(code *)local_2a8)(&local_2b8,&local_2b8,3);
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&local_318;
  std::
  vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
  ::vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
            *)local_298,__l,(allocator_type *)&local_2b8);
  if (local_308 != (code *)0x0) {
    (*local_308)(&local_318,&local_318,__destroy_functor);
  }
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(unsigned_short_&)> *)local_280,
             (ReturnAction *)&local_208);
  local_218 = (code *)0x0;
  pcStack_210 = (code *)0x0;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  local_228._M_unused._M_object = operator_new(0x38);
  *(undefined1 (*) [8])local_228._M_unused._0_8_ = local_298;
  *(pointer *)((long)local_228._M_unused._0_8_ + 8) = _Stack_290._M_p;
  *(undefined1 (*) [8])((long)local_228._M_unused._0_8_ + 0x10) = local_288;
  local_288 = (undefined1  [8])0x0;
  local_298 = (undefined1  [8])0x0;
  _Stack_290._M_p = (pointer)0x0;
  *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x28) = 0;
  *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x20) = 0;
  *(_Invoker_type *)((long)local_228._M_unused._0_8_ + 0x30) = p_Stack_268;
  if ((_Manager_type)local_270._M_p != (_Manager_type)0x0) {
    *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x18) = local_280._0_8_;
    *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x20) = local_280._8_8_;
    *(pointer *)((long)local_228._M_unused._0_8_ + 0x28) = local_270._M_p;
    local_270._M_p = (pointer)0x0;
    p_Stack_268 = (_Invoker_type)0x0;
  }
  local_228._8_8_ = 0;
  local_218 = std::_Function_handler::operator_cast_to_Action;
  pcStack_210 = std::_Function_handler::operator_cast_to_Action;
  std::
  vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
  ::~vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
             *)local_298);
  testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::WillOnce
            (this_00,(Action<ot::commissioner::Error_(unsigned_short_&)> *)&local_228);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
  }
  if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_188.mMessage._M_dataplus._M_p);
  }
  local_1f0.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short_&>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short_&>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short_&>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00397118;
  if (local_1f0.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short_&>_>.
      super__Head_base<0UL,_testing::Matcher<unsigned_short_&>,_false>._M_head_impl.
      super_MatcherBase<unsigned_short_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f0.matchers_.super__Tuple_impl<0UL,_testing::Matcher<unsigned_short_&>_>.
               super__Head_base<0UL,_testing::Matcher<unsigned_short_&>,_false>._M_head_impl.
               super_MatcherBase<unsigned_short_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_240.super_MatcherBase<unsigned_short_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00397118;
  if (local_240.super_MatcherBase<unsigned_short_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_240.super_MatcherBase<unsigned_short_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_298 = (undefined1  [8])local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"sessionid","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_2d8,&local_160.mInterpreter,(string *)local_298);
  local_2a8 = local_2f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8._8_8_ =
       local_2f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2b8._M_unused._M_object =
       local_2f8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2c8;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8._M_unused._0_8_;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8._8_8_;
  local_2d8._M_unused._M_object = (long *)0x0;
  local_2d8._8_8_ = 0;
  local_2c8 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_298,&local_160.mInterpreter,&local_2f8);
  local_1d0._0_4_ = local_298._0_4_;
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)&_Stack_290);
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_270);
  if (local_270._M_p != local_260) {
    operator_delete(local_270._M_p);
  }
  if ((Action<ot::commissioner::Error_(unsigned_short_&)> *)_Stack_290._M_p !=
      (Action<ot::commissioner::Error_(unsigned_short_&)> *)local_280) {
    operator_delete(_Stack_290._M_p);
  }
  bVar3 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_1d0);
  local_2b8._M_pod_data[0] = bVar3;
  local_2b8._8_8_ = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_298,(internal *)&local_2b8,(AssertionResult *)0x2ddeee,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x6b7,(char *)local_298);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if (local_298 != (undefined1  [8])local_288) {
      operator_delete((void *)local_298);
    }
    if ((long *)local_2d8._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_2d8._M_unused._M_object + 8))();
    }
    uVar2 = local_2b8._8_8_;
    if ((undefined8 *)local_2b8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2b8._8_8_ != (undefined8 *)(local_2b8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_2b8._8_8_);
      }
      operator_delete((void *)uVar2);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_p != &local_198) {
    operator_delete(local_1a8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8);
  InterpreterTestSuite::TestContext::~TestContext(&local_160);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Sessionid)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([=](uint16_t &a) { a = 1; }), Return(Error{})));
    expr  = ctx.mInterpreter.ParseExpression("sessionid");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}